

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O1

string * __thiscall
MinVR::VRDatumInt::getValueString_abi_cxx11_(string *__return_storage_ptr__,VRDatumInt *this)

{
  size_t sVar1;
  char buffer [20];
  char acStack_28 [24];
  
  sprintf(acStack_28,"%d",
          (ulong)*(uint *)&(this->super_VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>).value.
                           super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                           super__List_node_base._M_next[1]._M_next);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_28);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_28,acStack_28 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string VRDatumInt::getValueString() const {
  char buffer[20];
  sprintf(buffer, "%d", value.front());
  return std::string(buffer);
}